

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O0

void __thiscall
QPixmapIconEngine::paint
          (QPixmapIconEngine *this,QPainter *painter,QRect *rect,Mode mode,State state)

{
  QPixmap *pm;
  undefined4 in_ECX;
  QPainter *in_RDX;
  QPainter *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  long in_FS_OFFSET;
  qreal dpr;
  QPaintDevice *paintDevice;
  QPixmap px;
  QPixmap *this_00;
  QGuiApplication *in_stack_ffffffffffffffa0;
  QPixmap *pQVar1;
  QSize local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pm = (QPixmap *)QPainter::device(in_RDI);
  if (pm == (QPixmap *)0x0) {
    QCoreApplication::instance();
    this_00 = (QPixmap *)QGuiApplication::devicePixelRatio(in_stack_ffffffffffffffa0);
  }
  else {
    this_00 = (QPixmap *)QPaintDevice::devicePixelRatio((QPaintDevice *)CONCAT44(in_ECX,in_R8D));
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this_00;
  local_30 = QRect::size((QRect *)this_00);
  (**(code **)((long)&((in_RDI->d_ptr)._M_t.
                       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>
                       .super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl)->savedStates +
              0x28))((int)pQVar1,&local_28,in_RDI,&local_30,in_ECX,in_R8D,in_R9,&local_28);
  QPainter::drawPixmap(in_RDX,(QRect *)CONCAT44(in_ECX,in_R8D),pm);
  QPixmap::~QPixmap(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapIconEngine::paint(QPainter *painter, const QRect &rect, QIcon::Mode mode, QIcon::State state)
{
    auto paintDevice = painter->device();
    qreal dpr = paintDevice ? paintDevice->devicePixelRatio() : qApp->devicePixelRatio();
    QPixmap px = scaledPixmap(rect.size(), mode, state, dpr);
    painter->drawPixmap(rect, px);
}